

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableModel::removeColumns(QTableModel *this,int column,int count,QModelIndex *param_4)

{
  QTableWidgetItem *pQVar1;
  int iVar2;
  qsizetype qVar3;
  long lVar4;
  const_reference ppQVar5;
  int in_EDX;
  int in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int h;
  int j;
  int i;
  int row;
  QTableWidgetItem *oldItem;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QTableModel *in_stack_ffffffffffffff70;
  int local_70;
  int local_6c;
  int local_64;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_EDX < 1) || (in_ESI < 0)) ||
     (qVar3 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x48)),
     qVar3 < in_ESI + in_EDX)) {
    local_39 = false;
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x8d4484);
    QAbstractItemModel::beginRemoveColumns(in_RDI,(int)local_20,in_ESI);
    QModelIndex::QModelIndex((QModelIndex *)0x8d44b5);
    local_64 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,local_38);
    while (local_64 = local_64 + -1, local_70 = in_ESI, -1 < local_64) {
      lVar4 = tableIndex(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                         in_stack_ffffffffffffff68);
      iVar2 = (int)lVar4;
      for (local_6c = iVar2; local_6c < iVar2 + in_EDX; local_6c = local_6c + 1) {
        ppQVar5 = QList<QTableWidgetItem_*>::at
                            ((QList<QTableWidgetItem_*> *)in_stack_ffffffffffffff70,
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        pQVar1 = *ppQVar5;
        if (pQVar1 != (QTableWidgetItem *)0x0) {
          pQVar1->view = (QTableWidget *)0x0;
          (*pQVar1->_vptr_QTableWidgetItem[1])();
        }
      }
      QList<QTableWidgetItem_*>::remove
                ((QList<QTableWidgetItem_*> *)(in_RDI + 0x18),(char *)(long)iVar2);
    }
    for (; local_70 < in_ESI + in_EDX; local_70 = local_70 + 1) {
      ppQVar5 = QList<QTableWidgetItem_*>::at
                          ((QList<QTableWidgetItem_*> *)in_stack_ffffffffffffff70,
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      in_stack_ffffffffffffff70 = (QTableModel *)*ppQVar5;
      if (in_stack_ffffffffffffff70 != (QTableModel *)0x0) {
        (in_stack_ffffffffffffff70->tableItems).d.size = 0;
        (**(code **)(*(long *)in_stack_ffffffffffffff70 + 8))();
      }
    }
    QList<QTableWidgetItem_*>::remove
              ((QList<QTableWidgetItem_*> *)(in_RDI + 0x48),(char *)(long)in_ESI);
    QAbstractItemModel::endRemoveColumns();
    local_39 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::removeColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column + count >  horizontalHeaderItems.size())
        return false;

    beginRemoveColumns(QModelIndex(), column, column + count - 1);
    QTableWidgetItem *oldItem = nullptr;
    for (int row = rowCount() - 1; row >= 0; --row) {
        int i = tableIndex(row, column);
        for (int j = i; j < i + count; ++j) {
            oldItem = tableItems.at(j);
            if (oldItem)
                oldItem->view = nullptr;
            delete oldItem;
        }
        tableItems.remove(i, count);
    }
    for (int h=column; h<column+count; ++h) {
        oldItem = horizontalHeaderItems.at(h);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    horizontalHeaderItems.remove(column, count);
    endRemoveColumns();
    return true;
}